

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mv.h
# Opt level: O0

int_mv gm_get_motion_vector
                 (WarpedMotionParams *gm,int allow_hp,BLOCK_SIZE bsize,int mi_col,int mi_row,
                 int is_integer)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int_mv iVar7;
  int in_ECX;
  BLOCK_SIZE in_DL;
  int in_ESI;
  int *in_RDI;
  int in_R8D;
  int in_R9D;
  int yc;
  int xc;
  int ty;
  int tx;
  int y;
  int x;
  int32_t *mat;
  int_mv res;
  MV local_4;
  
  if ((char)in_RDI[8] == '\0') {
    local_4.row = 0;
    local_4.col = 0;
  }
  else if ((char)in_RDI[8] == '\x01') {
    local_4.col = (int16_t)(in_RDI[1] >> 0xd);
    local_4.row = (int16_t)(*in_RDI >> 0xd);
    if (in_R9D != 0) {
      integer_mv_precision(&local_4);
    }
  }
  else {
    iVar3 = block_center_x(in_ECX,in_DL);
    iVar4 = block_center_y(in_R8D,in_DL);
    iVar6 = in_RDI[4];
    iVar1 = in_RDI[5];
    iVar2 = in_RDI[1];
    iVar5 = convert_to_trans_prec
                      (in_ESI,(in_RDI[2] + -0x10000) * iVar3 + in_RDI[3] * iVar4 + *in_RDI);
    iVar6 = convert_to_trans_prec(in_ESI,iVar6 * iVar3 + (iVar1 + -0x10000) * iVar4 + iVar2);
    local_4.col = (int16_t)iVar5;
    local_4.row = (int16_t)iVar6;
    if (in_R9D != 0) {
      integer_mv_precision(&local_4);
    }
  }
  iVar7._0_2_ = local_4.row;
  iVar7._2_2_ = local_4.col;
  return (int_mv)iVar7.as_int;
}

Assistant:

static inline int_mv gm_get_motion_vector(const WarpedMotionParams *gm,
                                          int allow_hp, BLOCK_SIZE bsize,
                                          int mi_col, int mi_row,
                                          int is_integer) {
  int_mv res;

  if (gm->wmtype == IDENTITY) {
    res.as_int = 0;
    return res;
  }

  const int32_t *mat = gm->wmmat;
  int x, y, tx, ty;

  if (gm->wmtype == TRANSLATION) {
    // All global motion vectors are stored with WARPEDMODEL_PREC_BITS (16)
    // bits of fractional precision. The offset for a translation is stored in
    // entries 0 and 1. For translations, all but the top three (two if
    // cm->features.allow_high_precision_mv is false) fractional bits are always
    // zero.
    //
    // After the right shifts, there are 3 fractional bits of precision. If
    // allow_hp is false, the bottom bit is always zero (so we don't need a
    // call to convert_to_trans_prec here)
    //
    // Note: There is an AV1 specification bug here:
    //
    // gm->wmmat[0] is supposed to be the horizontal translation, and so should
    // go into res.as_mv.col, and gm->wmmat[1] is supposed to be the vertical
    // translation and so should go into res.as_mv.row
    //
    // However, in the spec, these assignments are accidentally reversed, and so
    // we must keep this incorrect logic to match the spec.
    //
    // See also: https://crbug.com/aomedia/3328
    res.as_mv.row = gm->wmmat[0] >> GM_TRANS_ONLY_PREC_DIFF;
    res.as_mv.col = gm->wmmat[1] >> GM_TRANS_ONLY_PREC_DIFF;
    assert(IMPLIES(1 & (res.as_mv.row | res.as_mv.col), allow_hp));
    if (is_integer) {
      integer_mv_precision(&res.as_mv);
    }
    return res;
  }

  x = block_center_x(mi_col, bsize);
  y = block_center_y(mi_row, bsize);

  if (gm->wmtype == ROTZOOM) {
    assert(gm->wmmat[5] == gm->wmmat[2]);
    assert(gm->wmmat[4] == -gm->wmmat[3]);
  }

  const int xc =
      (mat[2] - (1 << WARPEDMODEL_PREC_BITS)) * x + mat[3] * y + mat[0];
  const int yc =
      mat[4] * x + (mat[5] - (1 << WARPEDMODEL_PREC_BITS)) * y + mat[1];
  tx = convert_to_trans_prec(allow_hp, xc);
  ty = convert_to_trans_prec(allow_hp, yc);

  res.as_mv.row = ty;
  res.as_mv.col = tx;

  if (is_integer) {
    integer_mv_precision(&res.as_mv);
  }
  return res;
}